

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawData::ScaleClipRects(ImDrawData *this,ImVec2 *fb_scale)

{
  float *pfVar1;
  int iVar2;
  ImDrawList **ppIVar3;
  ImDrawCmd *pIVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar9 [16];
  float fVar8;
  float fVar10;
  
  iVar2 = this->CmdListsCount;
  if (0 < (long)iVar2) {
    ppIVar3 = this->CmdLists;
    lVar5 = 0;
    do {
      lVar6 = (long)(ppIVar3[lVar5]->CmdBuffer).Size;
      if (0 < lVar6) {
        pIVar4 = (ppIVar3[lVar5]->CmdBuffer).Data;
        lVar7 = 0;
        do {
          pfVar1 = (float *)((long)&(pIVar4->ClipRect).x + lVar7);
          fVar8 = (*fb_scale).x;
          auVar9._0_4_ = fVar8 * *pfVar1;
          fVar10 = (*fb_scale).y;
          auVar9._4_4_ = fVar10 * pfVar1[1];
          auVar9._8_4_ = fVar8 * pfVar1[2];
          auVar9._12_4_ = fVar10 * pfVar1[3];
          *(undefined1 (*) [16])((long)&(pIVar4->ClipRect).x + lVar7) = auVar9;
          lVar7 = lVar7 + 0x38;
        } while (lVar6 * 0x38 - lVar7 != 0);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  return;
}

Assistant:

void ImDrawData::ScaleClipRects(const ImVec2& fb_scale)
{
    for (int i = 0; i < CmdListsCount; i++)
    {
        ImDrawList* cmd_list = CmdLists[i];
        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            ImDrawCmd* cmd = &cmd_list->CmdBuffer[cmd_i];
            cmd->ClipRect = ImVec4(cmd->ClipRect.x * fb_scale.x, cmd->ClipRect.y * fb_scale.y, cmd->ClipRect.z * fb_scale.x, cmd->ClipRect.w * fb_scale.y);
        }
    }
}